

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiverFactory.cpp
# Opt level: O0

Bool __thiscall
Diligent::anon_unknown_0::ArchiverFactoryImpl::PrintArchiveContent
          (ArchiverFactoryImpl *this,IDataBlob *pArchive)

{
  undefined *puVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  string local_170;
  undefined1 local_150 [8];
  string _msg;
  CreateInfo local_120;
  undefined1 local_110 [8];
  DeviceObjectArchive ObjArchive;
  IDataBlob *pArchive_local;
  ArchiverFactoryImpl *this_local;
  
  local_120.ContentVersion = 0xffffffff;
  local_120.MakeCopy = false;
  local_120.pData = pArchive;
  ObjArchive._232_8_ = pArchive;
  DeviceObjectArchive::DeviceObjectArchive((DeviceObjectArchive *)local_110,&local_120);
  DeviceObjectArchive::ToString_abi_cxx11_(&local_170,(DeviceObjectArchive *)local_110);
  FormatString<std::__cxx11::string>((string *)local_150,(Diligent *)&local_170,Args);
  std::__cxx11::string::~string((string *)&local_170);
  puVar1 = DebugMessageCallback;
  if (DebugMessageCallback != (undefined *)0x0) {
    uVar2 = std::__cxx11::string::c_str();
    (*(code *)puVar1)(0,uVar2,0);
  }
  std::__cxx11::string::~string((string *)local_150);
  DeviceObjectArchive::~DeviceObjectArchive((DeviceObjectArchive *)local_110);
  return true;
}

Assistant:

Bool ArchiverFactoryImpl::PrintArchiveContent(const IDataBlob* pArchive) const
{
    try
    {
        DeviceObjectArchive ObjArchive{DeviceObjectArchive::CreateInfo{pArchive}};

        LOG_INFO_MESSAGE(ObjArchive.ToString());
        return true;
    }
    catch (...)
    {
        return false;
    }
}